

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_serialize(uchar *sig,size_t *size,secp256k1_scalar *ar,secp256k1_scalar *as)

{
  ulong *in_RSI;
  undefined1 *in_RDI;
  bool bVar1;
  size_t lenS;
  size_t lenR;
  uchar *sp;
  uchar *rp;
  uchar s [33];
  uchar r [33];
  secp256k1_scalar *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  ulong local_a8;
  ulong local_a0;
  char *local_98;
  char *local_90;
  char local_88 [48];
  char local_58 [64];
  ulong *local_18;
  undefined1 *local_10;
  uint local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_58,0,0x21);
  memset(local_88,0,0x21);
  local_90 = local_58;
  local_98 = local_88;
  local_a0 = 0x21;
  local_a8 = 0x21;
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             in_stack_ffffffffffffff48);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = false;
    if ((1 < local_a0) && (bVar1 = false, *local_90 == '\0')) {
      bVar1 = (byte)local_90[1] < 0x80;
    }
    if (!bVar1) break;
    local_a0 = local_a0 - 1;
    local_90 = local_90 + 1;
  }
  while( true ) {
    bVar1 = false;
    if ((1 < local_a8) && (bVar1 = false, *local_98 == '\0')) {
      bVar1 = (byte)local_98[1] < 0x80;
    }
    if (!bVar1) break;
    local_a8 = local_a8 - 1;
    local_98 = local_98 + 1;
  }
  bVar1 = local_a8 + 6 + local_a0 <= *local_18;
  if (bVar1) {
    *local_18 = local_a8 + 6 + local_a0;
    *local_10 = 0x30;
    local_10[1] = (char)local_a8 + '\x04' + (char)local_a0;
    local_10[2] = 2;
    local_10[3] = (char)local_a0;
    memcpy(local_10 + 4,local_90,local_a0);
    local_10[local_a0 + 4] = 2;
    local_10[local_a0 + 5] = (char)local_a8;
    memcpy(local_10 + local_a0 + 6,local_98,local_a8);
  }
  else {
    *local_18 = local_a8 + 6 + local_a0;
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

static int secp256k1_ecdsa_sig_serialize(unsigned char *sig, size_t *size, const secp256k1_scalar* ar, const secp256k1_scalar* as) {
    unsigned char r[33] = {0}, s[33] = {0};
    unsigned char *rp = r, *sp = s;
    size_t lenR = 33, lenS = 33;
    secp256k1_scalar_get_b32(&r[1], ar);
    secp256k1_scalar_get_b32(&s[1], as);
    while (lenR > 1 && rp[0] == 0 && rp[1] < 0x80) { lenR--; rp++; }
    while (lenS > 1 && sp[0] == 0 && sp[1] < 0x80) { lenS--; sp++; }
    if (*size < 6+lenS+lenR) {
        *size = 6 + lenS + lenR;
        return 0;
    }
    *size = 6 + lenS + lenR;
    sig[0] = 0x30;
    sig[1] = 4 + lenS + lenR;
    sig[2] = 0x02;
    sig[3] = lenR;
    memcpy(sig+4, rp, lenR);
    sig[4+lenR] = 0x02;
    sig[5+lenR] = lenS;
    memcpy(sig+lenR+6, sp, lenS);
    return 1;
}